

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  ushort uVar1;
  LuaType LVar2;
  RaviArray *t;
  Table *t_00;
  GCObject *pGVar3;
  TValue *key;
  int *piVar4;
  int iVar5;
  TValue *pTVar6;
  TValue *slot;
  StkId pTVar7;
  Value VVar8;
  char *pcVar9;
  uint uVar10;
  lua_Number d;
  Value local_20;
  
  iVar5 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar5 + 1;
  if (iVar5 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3fb,"void lua_seti(lua_State *, int, lua_Integer)");
  }
  if ((long)L->top - (long)L->ci->func < 0x11) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3fc,"void lua_seti(lua_State *, int, lua_Integer)");
  }
  pTVar6 = index2addr(L,idx);
  uVar1 = pTVar6->tt_;
  if (uVar1 == 0x8005 || (uVar1 & 0xf) != 5) {
    if ((uVar1 & 0xf) != 5) {
      slot = (TValue *)0x0;
LAB_00123d9d:
      pTVar7 = L->top;
      (pTVar7->value_).i = n;
      pTVar7->tt_ = 0x13;
      key = L->top;
      L->top = key + 1;
      if (L->ci->top < key + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x405,"void lua_seti(lua_State *, int, lua_Integer)");
      }
      luaV_finishset(L,pTVar6,key,key + -1,slot);
      pTVar7 = L->top + -2;
      goto LAB_00123e63;
    }
    if (uVar1 != 0x8005) {
      pcVar9 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_00123f2d:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    t_00 = (Table *)(pTVar6->value_).gc;
    if (t_00->tt != '\x05') {
      pcVar9 = "(((t)->value_).gc)->tt == 5";
      goto LAB_00123f2d;
    }
    if (n - 1U < (ulong)t_00->sizearray) {
      slot = t_00->array + (n - 1U);
    }
    else {
      slot = luaH_getint(t_00,n);
    }
    if (slot->tt_ == 0) goto LAB_00123d9d;
    pTVar7 = L->top;
    pGVar3 = pTVar7[-1].value_.gc;
    (slot->value_).gc = pGVar3;
    uVar1 = pTVar7[-1].tt_;
    slot->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      pcVar9 = "0";
LAB_00123f6f:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    pTVar7 = L->top;
    if ((short)pTVar7[-1].tt_ < 0) {
      if (-1 < (short)pTVar6->tt_) {
        pcVar9 = "(((t)->tt_) & (1 << 15))";
        goto LAB_00123f6f;
      }
      if (((((pTVar6->value_).gc)->marked & 0x20) != 0) &&
         (((pTVar7[-1].value_.gc)->marked & 0x18) != 0)) {
        luaC_barrierback_(L,(pTVar6->value_).gc);
        goto LAB_00123e5b;
      }
    }
  }
  else {
    if ((uVar1 != 0x8015) && (uVar1 != 0x8025)) {
      pcVar9 = 
      "(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_00123f05:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x40b,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    t = (RaviArray *)(pTVar6->value_).f;
    if ((t->tt != '\x15') && (t->tt != '%')) {
      pcVar9 = 
      "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_00123f05;
    }
    pTVar6 = L->top + -1;
    LVar2 = L->top[-1].tt_;
    uVar10 = (uint)n;
    if (uVar1 == 0x8025) {
      if (LVar2 == 0x13) {
        if (t->len <= uVar10) {
          VVar8.n = (double)(pTVar6->value_).i;
LAB_00123e4d:
          raviH_set_float(L,t,n & 0xffffffff,VVar8.n);
          goto LAB_00123e5b;
        }
        VVar8.n = (double)(pTVar6->value_).i;
      }
      else if (LVar2 == 3) {
        if (t->len <= uVar10) {
          VVar8.n = (pTVar6->value_).n;
          goto LAB_00123e4d;
        }
        VVar8 = pTVar6->value_;
      }
      else {
        local_20.gc = (GCObject *)0x0;
        iVar5 = luaV_tonumber_(pTVar6,&local_20.n);
        if (iVar5 == 0) {
          pcVar9 = "value cannot be converted to number";
          goto LAB_00123f5e;
        }
        VVar8 = local_20;
        if (t->len <= uVar10) goto LAB_00123e4d;
      }
      *(Value *)(t->data + (n & 0xffffffffU) * 8) = VVar8;
    }
    else {
      if (LVar2 == 0x13) {
        if (t->len <= uVar10) {
          VVar8.i = (pTVar6->value_).i;
LAB_00123e2a:
          raviH_set_int(L,t,n & 0xffffffff,VVar8.i);
          goto LAB_00123e5b;
        }
        pcVar9 = t->data;
        VVar8 = pTVar6->value_;
      }
      else {
        local_20.gc = (GCObject *)0x0;
        iVar5 = luaV_tointeger_(pTVar6,&local_20.i);
        if (iVar5 == 0) {
          pcVar9 = "value cannot be converted to integer";
LAB_00123f5e:
          luaG_runerror(L,pcVar9);
        }
        VVar8 = local_20;
        if (t->len <= uVar10) goto LAB_00123e2a;
        pcVar9 = t->data;
      }
      *(Value *)(pcVar9 + (n & 0xffffffffU) * 8) = VVar8;
    }
LAB_00123e5b:
    pTVar7 = L->top;
  }
  pTVar7 = pTVar7 + -1;
LAB_00123e63:
  L->top = pTVar7;
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x425,"void lua_seti(lua_State *, int, lua_Integer)");
  }
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  if (ttisLtable(t) || !ttistable(t)) {
    if (luaV_fastgeti(L, t, n, slot)) {
      luaV_finishfastset(L, t, slot, L->top - 1);
      L->top--;  /* pop value */
    }
    else {
      setivalue(L->top, n);
      api_incr_top(L);
      luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
      L->top -= 2;  /* pop value and key */	  
    }
  }
  else {
    RaviArray *h = arrvalue(t);
    if (ttisfarray(t)) {
      TValue *val = L->top - 1;
      if (ttisfloat(val)) { raviH_set_float_inline(L, h, n, fltvalue(val)); }
      else if (ttisinteger(val)) {
        raviH_set_float_inline(L, h, n, (lua_Number)(ivalue(val)));
      }
      else {
        lua_Number d = 0.0;
        if (luaV_tonumber_(val, &d)) { raviH_set_float_inline(L, h, n, d); }
        else
          luaG_runerror(L, "value cannot be converted to number");
      }
    } 
    else {
      TValue *val = L->top - 1;
      if (ttisinteger(val)) { raviH_set_int_inline(L, h, n, ivalue(val)); }
      else {
        lua_Integer i = 0;
        if (luaV_tointeger_(val, &i)) { raviH_set_int_inline(L, h, n, i); }
        else
          luaG_runerror(L, "value cannot be converted to integer");
      }
    }
    L->top--;  /* pop value */
  }
  lua_unlock(L);
}